

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.cpp
# Opt level: O0

int __thiscall Peers::remove(Peers *this,char *__filename)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  mapped_type *this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_d8;
  const_iterator local_d0;
  int *local_c8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_c0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b8;
  const_iterator local_b0;
  undefined1 local_a8 [8];
  vector<int,_std::allocator<int>_> ipPeers;
  _Self local_80;
  uint local_74;
  undefined1 local_70 [4];
  int port;
  string peerIp;
  string local_40;
  _Self local_20;
  iterator pos;
  Peer *peer_local;
  Peers *this_local;
  
  pos._M_node = (_Base_ptr)__filename;
  Peer::name_abi_cxx11_(&local_40,(Peer *)__filename);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>_>
       ::find(&this->m_peers,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  Peer::ip_abi_cxx11_((string *)local_70,(Peer *)pos._M_node);
  uVar2 = Peer::port((Peer *)pos._M_node);
  local_74 = (uint)uVar2;
  local_80._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>_>
       ::end(&this->m_peers);
  bVar1 = std::operator!=(&local_20,&local_80);
  if (bVar1) {
    ipPeers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::
                  map<std::__cxx11::string,std::unique_ptr<Peer,std::default_delete<Peer>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Peer,std::default_delete<Peer>>>>>
                  ::erase_abi_cxx11_((map<std::__cxx11::string,std::unique_ptr<Peer,std::default_delete<Peer>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Peer,std::default_delete<Peer>>>>>
                                      *)this,(iterator)local_20._M_node);
    this->m_count = this->m_count + -1;
  }
  ip2Peers((vector<int,_std::allocator<int>_> *)local_a8,this,(string *)local_70);
  local_c0._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_a8);
  local_c8 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)local_a8);
  local_b8 = std::
             remove<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                       (local_c0,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                                 local_c8,(int *)&local_74);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_b0,
             &local_b8);
  local_d8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_a8);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_d0,
             &local_d8);
  std::vector<int,_std::allocator<int>_>::erase
            ((vector<int,_std::allocator<int>_> *)local_a8,local_b0,local_d0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::operator[](&this->m_ip2PeerMap,(key_type *)local_70);
  std::vector<int,_std::allocator<int>_>::operator=
            (this_00,(vector<int,_std::allocator<int>_> *)local_a8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a8);
  iVar3 = std::__cxx11::string::~string((string *)local_70);
  return iVar3;
}

Assistant:

void Peers::remove(Peer *peer)
{
    std::map<std::string, std::unique_ptr<Peer>>::iterator pos = m_peers.find(peer->name());
    std::string peerIp = peer->ip();
    int port = peer->port();
    if (pos != m_peers.end()) {
        m_peers.erase(pos);
        --m_count;
    }
    std::vector<int> ipPeers = ip2Peers(peerIp);
    ipPeers.erase(std::remove(ipPeers.begin(), ipPeers.end(), port), ipPeers.end());
    m_ip2PeerMap[peerIp] = ipPeers;
}